

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O2

void mana_damageu(int n,monst *mtmp,char *k_name,int k_format,boolean missile)

{
  boolean bVar1;
  int iVar2;
  char *line;
  
  if (u.uprops[0x37].intrinsic != 0) {
    pline("You are unharmed!");
    return;
  }
  if (u.uprops[0x2c].extrinsic != 0) {
LAB_001ca6cf:
    line = "The missiles bounce off!";
    if (missile == '\0') {
      line = "You are unharmed!";
    }
    pline(line);
    ugolemeffects(1,n);
    return;
  }
  if (u.umonnum != u.umonster) {
    bVar1 = resists_magm(&youmonst);
    if (bVar1 != '\0') goto LAB_001ca6cf;
  }
  if (n != 0) {
    if (mtmp != (monst *)0x0) {
      mdamageu(mtmp,n);
      return;
    }
    losehp(n,k_name,k_format);
    if (missile != '\0') {
      exercise(0,'\0');
      return;
    }
    pline("Your body absorbs some of the magical energy!");
    iVar2 = rnd(n);
    u.uen = iVar2 + u.uenmax;
    u.uenmax = u.uen;
  }
  return;
}

Assistant:

void mana_damageu(int n, struct monst *mtmp, const char *k_name, int k_format,
		  boolean missile)
{
	if (Invulnerable) {
	    pline("You are unharmed!");
	    n = 0;
	} else {
	    if (Antimagic) {
		if (missile)
		    pline("The missiles bounce off!");
		else
		    pline("You are unharmed!");
		ugolemeffects(AD_MAGM, n);
		n = 0;
	    }
	}

	if (n) {
	    if (mtmp) {
		mdamageu(mtmp, n);
	    } else {
		losehp(n, k_name, k_format);
		if (!missile) {
		    pline("Your body absorbs some of the magical energy!");
		    u.uen = (u.uenmax += rnd(n));
		} else {
		    exercise(A_STR, FALSE);
		}
	    }
	}
}